

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall argstest::Command::Command(Command *this)

{
  function<bool_(const_argstest::Group_&)> local_50;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = Group::Validators::DontCare;
  local_50._M_invoker =
       std::_Function_handler<bool_(const_argstest::Group_&),_bool_(*)(const_argstest::Group_&)>::
       _M_invoke;
  local_50.super__Function_base._M_manager =
       std::_Function_handler<bool_(const_argstest::Group_&),_bool_(*)(const_argstest::Group_&)>::
       _M_manager;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  Group::Group(&this->super_Group,&local_30,&local_50,None);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  (this->super_Group).super_Base._vptr_Base = (_func_int **)&PTR__Command_0021d458;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  (this->help)._M_string_length = 0;
  (this->help).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->epilog)._M_dataplus._M_p = (pointer)&(this->epilog).field_2;
  (this->epilog)._M_string_length = 0;
  (this->epilog).field_2._M_local_buf[0] = '\0';
  (this->proglinePostfix)._M_dataplus._M_p = (pointer)&(this->proglinePostfix).field_2;
  (this->proglinePostfix)._M_string_length = 0;
  (this->proglinePostfix).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->parserCoroutine).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->parserCoroutine).super__Function_base._M_functor + 8) = 0;
  (this->parserCoroutine).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->parserCoroutine)._M_invoker = (_Invoker_type)0x0;
  this->commandIsRequired = true;
  this->subparserError = None;
  this->subparser = (Subparser *)0x0;
  *(undefined8 *)
   ((long)&(this->subparserProgramLine).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 3) = 0;
  *(undefined8 *)
   ((long)&(this->subparserProgramLine).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 3) = 0;
  (this->subparserProgramLine).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subparserProgramLine).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subparserDescription).
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subparserDescription).
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->selectedCommand = (Command *)0x0;
  (this->subparserDescription).
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Command() = default;